

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

void __thiscall Rml::ElementDocument::Hide(ElementDocument *this)

{
  undefined1 local_68 [16];
  pointer local_58;
  undefined8 local_40;
  PropertyDefinition *local_38;
  int local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_68._0_8_ = (pointer)0x2d;
  Variant::Set((Variant *)local_68,1);
  local_40._0_4_ = KEYWORD;
  local_40._4_4_ = -1;
  local_38 = (PropertyDefinition *)0x0;
  local_30 = -1;
  local_28 = (element_type *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Element::SetProperty(&this->super_Element,Visibility,(Property *)local_68);
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  Variant::~Variant((Variant *)local_68);
  UpdateDocument(this);
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_58 = (pointer)0x0;
  Element::DispatchEvent(&this->super_Element,Hide,(Dictionary *)local_68);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)local_68);
  if (this->context != (Context *)0x0) {
    Context::UnfocusDocument(this->context,this);
  }
  return;
}

Assistant:

void ElementDocument::Hide()
{
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Hidden));

	// We should update the document now, so that the (un)focusing will get the correct visibility
	UpdateDocument();

	DispatchEvent(EventId::Hide, Dictionary());

	if (context)
	{
		context->UnfocusDocument(this);
	}
}